

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgensubstruct.cpp
# Opt level: O2

TPZSubCompMesh * SubMesh(TPZAutoPointer<TPZCompMesh> *compmesh,int isub)

{
  bool bVar1;
  TPZCompEl **ppTVar2;
  TPZSubCompMesh *pTVar3;
  long lVar4;
  long nelem;
  long lVar5;
  
  lVar4 = (compmesh->fRef->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (lVar4 < 1) {
    lVar4 = 0;
  }
  nelem = 0;
  lVar5 = 0;
  do {
    if (lVar4 == nelem) {
      return (TPZSubCompMesh *)0x0;
    }
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(compmesh->fRef->fPointer->fElementVec).
                          super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
    if (*ppTVar2 != (TPZCompEl *)0x0) {
      pTVar3 = (TPZSubCompMesh *)
               __dynamic_cast(*ppTVar2,&TPZCompEl::typeinfo,&TPZSubCompMesh::typeinfo,0x918);
      bVar1 = lVar5 == isub && pTVar3 != (TPZSubCompMesh *)0x0;
      if (bVar1) {
        return pTVar3;
      }
      lVar5 = lVar5 + (ulong)((pTVar3 != (TPZSubCompMesh *)0x0) != bVar1);
    }
    nelem = nelem + 1;
  } while( true );
}

Assistant:

TPZSubCompMesh *SubMesh(TPZAutoPointer<TPZCompMesh> compmesh, int isub)
{
	int64_t nel = compmesh->NElements();
	TPZCompEl *cel;
	int64_t iel, count = 0;
	for(iel=0; iel<nel; iel++)
	{
		cel = compmesh->ElementVec()[iel];
		if(!cel) continue;
		TPZSubCompMesh *sub = dynamic_cast<TPZSubCompMesh *>(cel);
		if(sub && isub == count) return sub;
		if(sub) count++;
	}
	return NULL;
}